

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_api_json_autogen.cpp
# Opt level: O0

void cfd::api::json::PsbtGlobalXpub::CollectFieldName(void)

{
  bool bVar1;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::PsbtGlobalXpub>_>_>,_bool>
  pVar2;
  CLASS_FUNCTION_TABLE<cfd::api::json::PsbtGlobalXpub> func_table;
  CLASS_FUNCTION_TABLE<cfd::api::json::PsbtGlobalXpub> *in_stack_fffffffffffffc88;
  CLASS_FUNCTION_TABLE<cfd::api::json::PsbtGlobalXpub> *in_stack_fffffffffffffc90;
  CLASS_FUNCTION_TABLE<cfd::api::json::PsbtGlobalXpub> *this;
  char (*in_stack_fffffffffffffc98) [19];
  char (*__args) [15];
  function<void_(cfd::api::json::PsbtGlobalXpub_&,_const_UniValue_&)> *in_stack_fffffffffffffca0;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::PsbtGlobalXpub>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::PsbtGlobalXpub>_>_>_>
  *this_00;
  CLASS_FUNCTION_TABLE<cfd::api::json::PsbtGlobalXpub> local_2c9;
  allocator local_231;
  value_type local_230;
  _Base_ptr local_210;
  undefined1 local_208;
  allocator local_199;
  value_type local_198;
  _Base_ptr local_178;
  undefined1 local_170;
  allocator local_101;
  value_type local_100;
  _Base_ptr local_e0;
  undefined1 local_d8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::PsbtGlobalXpub>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::PsbtGlobalXpub>_>_>_>
  local_60 [2];
  
  bVar1 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::PsbtGlobalXpub>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::PsbtGlobalXpub>_>_>_>
          ::empty((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::PsbtGlobalXpub>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::PsbtGlobalXpub>_>_>_>
                   *)0x6ad4c3);
  if (bVar1) {
    core::CLASS_FUNCTION_TABLE<cfd::api::json::PsbtGlobalXpub>::CLASS_FUNCTION_TABLE
              (in_stack_fffffffffffffc90);
    std::function<std::__cxx11::string(cfd::api::json::PsbtGlobalXpub_const&)>::
    function<std::__cxx11::string(&)(cfd::api::json::PsbtGlobalXpub_const&),void>
              ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::PsbtGlobalXpub_&)>
                *)in_stack_fffffffffffffca0,
               (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_PsbtGlobalXpub_ptr
                *)in_stack_fffffffffffffc98);
    std::function<void(cfd::api::json::PsbtGlobalXpub&,UniValue_const&)>::
    function<void(&)(cfd::api::json::PsbtGlobalXpub&,UniValue_const&),void>
              (in_stack_fffffffffffffca0,
               (_func_void_PsbtGlobalXpub_ptr_UniValue_ptr *)in_stack_fffffffffffffc98);
    std::function<std::__cxx11::string()>::function<std::__cxx11::string(&)(),void>
              ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
                *)in_stack_fffffffffffffca0,
               (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffc98);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::PsbtGlobalXpub>::operator=
              (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::PsbtGlobalXpub>::~CLASS_FUNCTION_TABLE
              (in_stack_fffffffffffffc90);
    pVar2 = std::
            map<std::__cxx11::string,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::PsbtGlobalXpub>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::PsbtGlobalXpub>>>>
            ::
            emplace<char_const(&)[5],cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::PsbtGlobalXpub>&>
                      ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::PsbtGlobalXpub>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::PsbtGlobalXpub>_>_>_>
                        *)in_stack_fffffffffffffca0,(char (*) [5])in_stack_fffffffffffffc98,
                       in_stack_fffffffffffffc90);
    local_e0 = (_Base_ptr)pVar2.first._M_node;
    local_d8 = pVar2.second;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_100,"xpub",&local_101);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)item_list_abi_cxx11_,&local_100);
    std::__cxx11::string::~string((string *)&local_100);
    std::allocator<char>::~allocator((allocator<char> *)&local_101);
    std::function<std::__cxx11::string(cfd::api::json::PsbtGlobalXpub_const&)>::
    function<std::__cxx11::string(&)(cfd::api::json::PsbtGlobalXpub_const&),void>
              ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::PsbtGlobalXpub_&)>
                *)in_stack_fffffffffffffca0,
               (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_PsbtGlobalXpub_ptr
                *)in_stack_fffffffffffffc98);
    std::function<void(cfd::api::json::PsbtGlobalXpub&,UniValue_const&)>::
    function<void(&)(cfd::api::json::PsbtGlobalXpub&,UniValue_const&),void>
              (in_stack_fffffffffffffca0,
               (_func_void_PsbtGlobalXpub_ptr_UniValue_ptr *)in_stack_fffffffffffffc98);
    std::function<std::__cxx11::string()>::function<std::__cxx11::string(&)(),void>
              ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
                *)in_stack_fffffffffffffca0,
               (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffc98);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::PsbtGlobalXpub>::operator=
              (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::PsbtGlobalXpub>::~CLASS_FUNCTION_TABLE
              (in_stack_fffffffffffffc90);
    pVar2 = std::
            map<std::__cxx11::string,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::PsbtGlobalXpub>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::PsbtGlobalXpub>>>>
            ::
            emplace<char_const(&)[19],cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::PsbtGlobalXpub>&>
                      ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::PsbtGlobalXpub>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::PsbtGlobalXpub>_>_>_>
                        *)in_stack_fffffffffffffca0,in_stack_fffffffffffffc98,
                       in_stack_fffffffffffffc90);
    local_178 = (_Base_ptr)pVar2.first._M_node;
    local_170 = pVar2.second;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_198,"master_fingerprint",&local_199);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)item_list_abi_cxx11_,&local_198);
    std::__cxx11::string::~string((string *)&local_198);
    std::allocator<char>::~allocator((allocator<char> *)&local_199);
    std::function<std::__cxx11::string(cfd::api::json::PsbtGlobalXpub_const&)>::
    function<std::__cxx11::string(&)(cfd::api::json::PsbtGlobalXpub_const&),void>
              ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::PsbtGlobalXpub_&)>
                *)in_stack_fffffffffffffca0,
               (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_PsbtGlobalXpub_ptr
                *)in_stack_fffffffffffffc98);
    std::function<void(cfd::api::json::PsbtGlobalXpub&,UniValue_const&)>::
    function<void(&)(cfd::api::json::PsbtGlobalXpub&,UniValue_const&),void>
              (in_stack_fffffffffffffca0,
               (_func_void_PsbtGlobalXpub_ptr_UniValue_ptr *)in_stack_fffffffffffffc98);
    std::function<std::__cxx11::string()>::function<std::__cxx11::string(&)(),void>
              ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
                *)in_stack_fffffffffffffca0,
               (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffc98);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::PsbtGlobalXpub>::operator=
              (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::PsbtGlobalXpub>::~CLASS_FUNCTION_TABLE
              (in_stack_fffffffffffffc90);
    pVar2 = std::
            map<std::__cxx11::string,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::PsbtGlobalXpub>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::PsbtGlobalXpub>>>>
            ::
            emplace<char_const(&)[5],cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::PsbtGlobalXpub>&>
                      ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::PsbtGlobalXpub>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::PsbtGlobalXpub>_>_>_>
                        *)in_stack_fffffffffffffca0,(char (*) [5])in_stack_fffffffffffffc98,
                       in_stack_fffffffffffffc90);
    local_210 = (_Base_ptr)pVar2.first._M_node;
    local_208 = pVar2.second;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_230,"path",&local_231);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)item_list_abi_cxx11_,&local_230);
    std::__cxx11::string::~string((string *)&local_230);
    std::allocator<char>::~allocator((allocator<char> *)&local_231);
    __args = (char (*) [15])((long)&local_2c9.set_function.super__Function_base._M_manager + 1);
    std::function<std::__cxx11::string(cfd::api::json::PsbtGlobalXpub_const&)>::
    function<std::__cxx11::string(&)(cfd::api::json::PsbtGlobalXpub_const&),void>
              ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::PsbtGlobalXpub_&)>
                *)in_stack_fffffffffffffca0,
               (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_PsbtGlobalXpub_ptr
                *)__args);
    std::function<void(cfd::api::json::PsbtGlobalXpub&,UniValue_const&)>::
    function<void(&)(cfd::api::json::PsbtGlobalXpub&,UniValue_const&),void>
              (in_stack_fffffffffffffca0,(_func_void_PsbtGlobalXpub_ptr_UniValue_ptr *)__args);
    std::function<std::__cxx11::string()>::function<std::__cxx11::string(&)(),void>
              ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
                *)in_stack_fffffffffffffca0,
               (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__args);
    this_00 = local_60;
    core::CLASS_FUNCTION_TABLE<cfd::api::json::PsbtGlobalXpub>::operator=
              (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::PsbtGlobalXpub>::~CLASS_FUNCTION_TABLE
              (in_stack_fffffffffffffc90);
    pVar2 = std::
            map<std::__cxx11::string,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::PsbtGlobalXpub>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::PsbtGlobalXpub>>>>
            ::
            emplace<char_const(&)[15],cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::PsbtGlobalXpub>&>
                      (this_00,__args,in_stack_fffffffffffffc90);
    local_2c9.set_function.super__Function_base._M_functor._1_8_ = pVar2.first._M_node;
    local_2c9.set_function.super__Function_base._M_functor._M_pod_data[9] = pVar2.second;
    this = &local_2c9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)
               ((long)local_2c9.get_function.super__Function_base._M_functor._M_pod_data + 1),
               "descriptorXpub",(allocator *)this);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)item_list_abi_cxx11_,
                (value_type *)
                ((long)local_2c9.get_function.super__Function_base._M_functor._M_pod_data + 1));
    std::__cxx11::string::~string
              ((string *)
               ((long)local_2c9.get_function.super__Function_base._M_functor._M_pod_data + 1));
    std::allocator<char>::~allocator((allocator<char> *)&local_2c9);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::PsbtGlobalXpub>::~CLASS_FUNCTION_TABLE(this);
  }
  return;
}

Assistant:

void PsbtGlobalXpub::CollectFieldName() {
  if (!json_mapper.empty()) {
    return;
  }
  cfd::core::CLASS_FUNCTION_TABLE<PsbtGlobalXpub> func_table;  // NOLINT

  func_table = {
    PsbtGlobalXpub::GetXpubString,
    PsbtGlobalXpub::SetXpubString,
    PsbtGlobalXpub::GetXpubFieldType,
  };
  json_mapper.emplace("xpub", func_table);
  item_list.push_back("xpub");
  func_table = {
    PsbtGlobalXpub::GetMaster_fingerprintString,
    PsbtGlobalXpub::SetMaster_fingerprintString,
    PsbtGlobalXpub::GetMaster_fingerprintFieldType,
  };
  json_mapper.emplace("master_fingerprint", func_table);
  item_list.push_back("master_fingerprint");
  func_table = {
    PsbtGlobalXpub::GetPathString,
    PsbtGlobalXpub::SetPathString,
    PsbtGlobalXpub::GetPathFieldType,
  };
  json_mapper.emplace("path", func_table);
  item_list.push_back("path");
  func_table = {
    PsbtGlobalXpub::GetDescriptorXpubString,
    PsbtGlobalXpub::SetDescriptorXpubString,
    PsbtGlobalXpub::GetDescriptorXpubFieldType,
  };
  json_mapper.emplace("descriptorXpub", func_table);
  item_list.push_back("descriptorXpub");
}